

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Commands.h
# Opt level: O0

void JumpMission(int linenumber)

{
  int iVar1;
  int linenumber_local;
  
  EnterCriticalSection(&MissionFilesCS);
  if (bMissionRunning == 0) {
    printf("Cannot use jump outside a mission file.\n");
  }
  else if (linenumber < 1) {
    printf("Invalid parameter.\n");
  }
  else {
    iVar1 = fsetline(missionfile,linenumber);
    if (iVar1 != 0) {
      printf("jump failed.\n");
    }
  }
  LeaveCriticalSection(&MissionFilesCS);
  return;
}

Assistant:

inline void JumpMission(int linenumber)
{
	EnterCriticalSection(&MissionFilesCS);
	if (bMissionRunning)
	{
		if (linenumber > 0)
		{
			if (fsetline(missionfile, linenumber) != EXIT_SUCCESS)
			{
				printf("jump failed.\n");
			}
		}
		else
		{
			printf("Invalid parameter.\n");
		}
	}
	else
	{
		printf("Cannot use jump outside a mission file.\n");
	}
	LeaveCriticalSection(&MissionFilesCS);
}